

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O1

Vec_Ptr_t * Abc_NodeGetFaninNames(Abc_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  char *__s;
  size_t sVar6;
  char *__dest;
  int iVar7;
  long lVar8;
  
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  if (0 < (pNode->vFanins).nSize) {
    lVar8 = 0;
    do {
      plVar3 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
      __s = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar3 + 0x18),(int)plVar3[2]);
      if (__s == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar6 = strlen(__s);
        __dest = (char *)malloc(sVar6 + 1);
        strcpy(__dest,__s);
      }
      uVar1 = pVVar4->nSize;
      uVar2 = pVVar4->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar2 * 2;
          if (iVar7 <= (int)uVar2) goto LAB_001dfcfa;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = iVar7;
      }
LAB_001dfcfa:
      pVVar4->nSize = uVar1 + 1;
      pVVar4->pArray[(int)uVar1] = __dest;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pNode->vFanins).nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Abc_NodeGetFaninNames( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pFanin;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Vec_PtrPush( vNodes, Abc_UtilStrsav(Abc_ObjName(pFanin)) );
    return vNodes;
}